

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write<char,std::back_insert_iterator<std::__cxx11::string>>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,char *value)

{
  size_type sVar1;
  size_t __n;
  format_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  
  if (value != (char *)0x0) {
    __n = strlen(value);
    sVar1 = (out.container)->_M_string_length;
    std::__cxx11::string::resize((ulong)out.container,(char)sVar1 + (char)__n);
    if (__n != 0) {
      memmove(((out.container)->_M_dataplus)._M_p + sVar1,value,__n);
    }
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )out.container;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this,"string pointer is null");
  __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}